

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<SmallBlock<16>_*,_false,_false>::grow_and_add
          (FastVector<SmallBlock<16>_*,_false,_false> *this,uint newSize,SmallBlock<16> **val)

{
  uint uVar1;
  uint uVar2;
  SmallBlock<16> **ptr;
  SmallBlock<16> *pSVar3;
  uint oldMax;
  SmallBlock<16> **oldData;
  SmallBlock<16> **val_local;
  uint newSize_local;
  FastVector<SmallBlock<16>_*,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  pSVar3 = *val;
  uVar2 = this->count;
  this->count = uVar2 + 1;
  this->data[uVar2] = pSVar3;
  if (ptr != (SmallBlock<16> **)0x0) {
    NULLC::destruct<SmallBlock<16>*>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}